

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

unique_ptr<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>,_true>
duckdb::UniqueConstructor::
Create<duckdb::ListColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
          (BlockManager *args,DataTableInfo *args_1,unsigned_long *args_2,unsigned_long *args_3,
          LogicalType *args_4,optional_ptr<duckdb::ColumnData,_true> *args_5)

{
  unique_ptr<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>_> in_RDI;
  DataTableInfo *in_stack_00000040;
  BlockManager *in_stack_00000048;
  optional_ptr<duckdb::ColumnData,_true> *in_stack_00000060;
  
  make_uniq<duckdb::ListColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
            (in_stack_00000048,in_stack_00000040,(unsigned_long *)args,(unsigned_long *)args_1,
             (LogicalType *)args_2,in_stack_00000060);
  return (unique_ptr<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>_>)
         (__uniq_ptr_impl<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ListColumnData_*,_std::default_delete<duckdb::ListColumnData>_>
         .super__Head_base<0UL,_duckdb::ListColumnData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<T> Create(ARGS &&...args) {
		return make_uniq<T>(std::forward<ARGS>(args)...);
	}